

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O0

bool __thiscall HashTable<int>::Insert(HashTable<int> *this,int value,int address)

{
  node *pnVar1;
  Node *newNode;
  Node *p;
  int address_local;
  int value_local;
  HashTable<int> *this_local;
  
  if (this->HashArray[address].value == 9999999) {
    this->HashArray[address].key = address;
    this->HashArray[address].value = value;
    this->HashArray[address].next = (node *)0x0;
  }
  else {
    for (newNode = this->HashArray + address; newNode->next != (node *)0x0; newNode = newNode->next)
    {
    }
    pnVar1 = (node *)operator_new(0x10);
    pnVar1->key = address;
    pnVar1->value = value;
    pnVar1->next = (node *)0x0;
    newNode->next = pnVar1;
  }
  return true;
}

Assistant:

bool Insert(DataType value, int address) {
		//哈希数组为空
		if (HashArray[address].value == MyNull) {
			HashArray[address].key = address;
			HashArray[address].value = value;
			HashArray[address].next = NULL;
		}
		else {   //数组中已被占用，用链址法构建单链表
			Node *p = &HashArray[address];

			while (p->next != NULL)
				p = p->next;

			Node *newNode = new Node;
			newNode->key = address;
			newNode->value = value;
			newNode->next = NULL;

			p->next = newNode;
		}
		return true;
	}